

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O0

boolean write_level_file(char *filename,sp_lev *lvl)

{
  boolean bVar1;
  int iVar2;
  char local_68 [8];
  char lbuf [60];
  int fout;
  sp_lev *lvl_local;
  char *filename_local;
  
  if (decompile != 0) {
    local_68[0] = '\0';
    strcat(local_68,outprefix);
    strcat(local_68,filename);
    strcat(local_68,"_lev.txt");
    iVar2 = open(local_68,0x241,0x1a4);
    if (iVar2 < 0) {
      return '\0';
    }
    decompile_maze(iVar2,lvl);
    close(iVar2);
  }
  local_68[0] = '\0';
  strcat(local_68,outprefix);
  strcat(local_68,filename);
  strcat(local_68,".lev");
  iVar2 = open(local_68,0x41,0x1a4);
  if (iVar2 < 0) {
    filename_local._7_1_ = '\0';
  }
  else {
    if (lvl == (sp_lev *)0x0) {
      panic("write_level_file");
    }
    if (be_verbose != 0) {
      fprintf(_stdout,"File: \'%s\', opcodes: %li\n",local_68,lvl->n_opcodes);
    }
    bVar1 = write_maze(iVar2,lvl);
    if (bVar1 == '\0') {
      filename_local._7_1_ = '\0';
    }
    else {
      close(iVar2);
      filename_local._7_1_ = '\x01';
    }
  }
  return filename_local._7_1_;
}

Assistant:

boolean write_level_file(char *filename, sp_lev *lvl)
{
	int fout;
	char lbuf[60];

	if (decompile) {
	    lbuf[0] = '\0';
	    strcat(lbuf, outprefix);
	    strcat(lbuf, filename);
	    strcat(lbuf, "_lev.txt");
	    fout = open(lbuf, O_TRUNC|O_WRONLY|O_CREAT, OMASK);
	    if (fout < 0) return FALSE;
	    decompile_maze(fout, lvl);
	    close(fout);
	}

	lbuf[0] = '\0';
	strcat(lbuf, outprefix);
	strcat(lbuf, filename);
	strcat(lbuf, LEV_EXT);

	fout = open(lbuf, O_WRONLY|O_CREAT|O_BINARY, OMASK);
	if (fout < 0) return FALSE;

	if (!lvl) panic("write_level_file");

	if (be_verbose)
	    fprintf(stdout, "File: '%s', opcodes: %li\n", lbuf, lvl->n_opcodes);

	if (!write_maze(fout, lvl))
	    return FALSE;

	close(fout);

	return TRUE;
}